

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall QGraphicsView::items(QGraphicsView *this,QPoint *pos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QGraphicsViewPrivate *pQVar4;
  QTransform *deviceTransform;
  QGraphicsScene *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QTransform xinv;
  QTransform *in_stack_fffffffffffffe20;
  QRectF *rect;
  QRectF local_188;
  undefined1 local_168 [272];
  bool local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rect = in_RDI;
  pQVar4 = d_func((QGraphicsView *)0xa34e77);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa34e8d);
  if (bVar1) {
    if ((*(uint *)&pQVar4->field_0x300 >> 4 & 1) == 0) {
      iVar2 = QTransform::type();
      if (2 < iVar2) {
        QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa34fe2);
        QPoint::x((QPoint *)0xa34ff1);
        QPoint::y((QPoint *)0xa34fff);
        mapToScene((QGraphicsView *)rect,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),(int)in_stack_fffffffffffffe20);
        viewportTransform((QGraphicsView *)in_RDI);
        QGraphicsScene::items
                  (in_RSI,(QPolygonF *)rect,(ItemSelectionMode)((ulong)in_RDI >> 0x20),
                   (SortOrder)in_RDI,in_stack_fffffffffffffe20);
        QPolygonF::~QPolygonF((QPolygonF *)0xa3505e);
        goto LAB_00a3505e;
      }
    }
    memcpy(local_58,&DAT_00b47f68,0x50);
    viewportTransform((QGraphicsView *)in_RDI);
    QTransform::inverted(local_58);
    deviceTransform =
         (QTransform *)QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa34f36);
    iVar2 = QPoint::x((QPoint *)0xa34f45);
    iVar3 = QPoint::y((QPoint *)0xa34f59);
    QRectF::QRectF(&local_188,(double)iVar2,(double)iVar3,1.0,1.0);
    QTransform::mapRect((QRectF *)local_168);
    viewportTransform((QGraphicsView *)in_RDI);
    QGraphicsScene::items
              (in_RSI,rect,(ItemSelectionMode)((ulong)in_RDI >> 0x20),(SortOrder)in_RDI,
               deviceTransform);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa34eac);
  }
LAB_00a3505e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QGraphicsItem_*> *)rect;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsView::items(const QPoint &pos) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QList<QGraphicsItem *>();
    // ### Unify these two, and use the items(QPointF) version in
    // QGraphicsScene instead. The scene items function could use the viewport
    // transform to map the point to a rect/polygon.
    if ((d->identityMatrix || d->matrix.type() <= QTransform::TxScale)) {
        // Use the rect version
        QTransform xinv = viewportTransform().inverted();
        return d->scene->items(xinv.mapRect(QRectF(pos.x(), pos.y(), 1, 1)),
                               Qt::IntersectsItemShape,
                               Qt::DescendingOrder,
                               viewportTransform());
    }
    // Use the polygon version
    return d->scene->items(mapToScene(pos.x(), pos.y(), 1, 1),
                           Qt::IntersectsItemShape,
                           Qt::DescendingOrder,
                           viewportTransform());
}